

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O3

bool __thiscall
snmalloc::
Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_21UL>
::remove_buddy(Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_21UL>
               *this,Contents addr,size_t size)

{
  bool bVar1;
  ulong uVar2;
  K KVar3;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *this_00;
  long lVar4;
  ulong uVar5;
  RBPath path;
  undefined8 uStack_830;
  RBPath local_828;
  
  uVar5 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar2 = 0xfffffffffffffff2;
  if (size != 1) {
    uVar2 = (uVar5 ^ 0xffffffffffffffc0) + 0x33;
  }
  if (uVar2 < this->empty_at_or_above) {
    uVar5 = size ^ addr;
    lVar4 = 0;
    do {
      if (uVar5 == *(ulong *)((long)(this->entries)._M_elems[uVar2].cache + lVar4)) {
        if (uVar5 < addr) {
          uVar5 = addr;
        }
        if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                ::concretePagemap.body)->
                              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                              ).super_MetaEntryBase.meta + (uVar5 >> 10 & 0xfffffffffffffff0)) & 1)
            == 0) {
          uStack_830 = 0x108bef;
          KVar3 = RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
                  ::remove_min(&(this->entries)._M_elems[uVar2].tree);
          *(K *)((long)(this->entries)._M_elems[uVar2].cache + lVar4) = KVar3;
          return true;
        }
        return false;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    lVar4 = 8;
    do {
      *(undefined8 *)((long)&uStack_830 + lVar4) = 0;
      *(undefined1 *)((long)&local_828.path._M_elems[0].node.ptr.val + lVar4) = 0;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x808);
    this_00 = &(this->entries)._M_elems[uVar2].tree;
    local_828.path._M_elems[0].dir = false;
    local_828.length = 1;
    uStack_830 = 0x108b98;
    local_828.path._M_elems[0].node.ptr.val = (H)(H)this_00;
    bVar1 = RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
            ::find(this_00,&local_828,uVar5);
    if (bVar1) {
      if (uVar5 < addr) {
        uVar5 = addr;
      }
      if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.meta + (uVar5 >> 10 & 0xfffffffffffffff0)) & 1) ==
          0) {
        uStack_830 = 0x108bc4;
        RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
        ::remove_path(this_00,&local_828);
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

inline size_t next_pow2_bits(size_t x)
    {
      // Correct for numbers [1..MAX_SIZE].
      if (x == 1)
        return 0;

      return BITS - clz(x - 1);
    }